

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_fill_extcomplex_module
              (ly_ctx *ctx,lys_ext_instance_complex *ext,char *parent_name,char **values,
              int implemented)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long *__ptr;
  lys_module *plVar5;
  LY_ERR *pLVar6;
  LY_ECODE code;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  lyext_substmt *local_50;
  lyext_substmt *info;
  char *local_40;
  int local_34;
  
  iVar10 = 0;
  if (values != (char **)0x0) {
    info = (lyext_substmt *)ctx;
    local_34 = implemented;
    plVar3 = (long *)lys_ext_complex_get_substmt(LY_STMT_MODULE,ext,&local_50);
    if (plVar3 == (long *)0x0) {
      code = LYE_INCHILDSTMT;
LAB_00151e41:
      ly_vlog(code,LY_VLOG_NONE,(void *)0x0,"module",parent_name);
LAB_00151e48:
      iVar10 = 1;
    }
    else {
      iVar10 = 0;
      if (*values != (char *)0x0) {
        lVar11 = 0;
        __ptr = plVar3;
        local_40 = parent_name;
        do {
          if (local_50->cardinality < LY_STMT_CARD_SOME) {
            if (*__ptr != 0) {
              code = LYE_TOOMANY;
              parent_name = local_40;
              goto LAB_00151e41;
            }
LAB_00151df7:
            uVar9 = 0;
          }
          else {
            __ptr = (long *)*plVar3;
            if (__ptr == (long *)0x0) {
              __ptr = (long *)calloc(2,8);
              *plVar3 = (long)__ptr;
              goto LAB_00151df7;
            }
            if (*__ptr == 0) goto LAB_00151df7;
            plVar4 = __ptr;
            uVar9 = 0;
            do {
              uVar8 = uVar9;
              plVar1 = plVar4 + 1;
              plVar4 = plVar4 + 1;
              uVar7 = (int)uVar8 + 1;
              uVar9 = (ulong)uVar7;
            } while (*plVar1 != 0);
            __ptr = (long *)realloc(__ptr,uVar8 * 8 + 0x18);
            if (__ptr == (long *)0x0) {
              pLVar6 = ly_errno_location();
              *pLVar6 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_extcomplex_module");
              goto LAB_00151e48;
            }
            *plVar3 = (long)__ptr;
            uVar9 = (ulong)uVar7;
            __ptr[uVar9 + 1] = 0;
          }
          plVar5 = yang_read_module((ly_ctx *)info,values[lVar11],0,(char *)0x0,local_34);
          __ptr[uVar9] = (long)plVar5;
          if (plVar5 == (lys_module *)0x0) goto LAB_00151e48;
          lVar2 = lVar11 + 1;
          lVar11 = lVar11 + 1;
        } while (values[lVar2] != (char *)0x0);
        iVar10 = 0;
      }
    }
  }
  return iVar10;
}

Assistant:

int
yang_fill_extcomplex_module(struct ly_ctx *ctx, struct lys_ext_instance_complex *ext,
                            char *parent_name, char **values, int implemented)
{
    int c, i;
    struct lys_module **modules, ***p, *reallocated, **pp;
    struct lyext_substmt *info;

    if (!values) {
        return EXIT_SUCCESS;
    }
    pp = modules = lys_ext_complex_get_substmt(LY_STMT_MODULE, ext, &info);
    if (!modules) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "module", parent_name);
        return EXIT_FAILURE;
    }

    for (i = 0; values[i]; ++i) {
        c = 0;
        if (info->cardinality < LY_STMT_CARD_SOME && *modules) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "module", parent_name);
            return EXIT_FAILURE;
        }
        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, so instead of pointer to array,
             * we have in modules pointer to pointer to array */
            p = (struct lys_module ***)pp;
            modules = *p;
            if (!modules) {
                /* allocate initial array */
                *p = modules = calloc(2, sizeof(struct lys_module *));
            } else {
                for (c = 0; *modules; modules++, c++);
            }
        }

        if (c) {
            /* enlarge the array */
            reallocated = realloc(*p, (c + 2) * sizeof(struct lys_module *));
            if (!reallocated) {
                LOGMEM;
                return EXIT_FAILURE;
            }
            *p = (struct lys_module **)reallocated;
            modules = *p;
            modules[c + 1] = NULL;
        }

        modules[c] = yang_read_module(ctx, values[i], 0, NULL, implemented);
        if (!modules[c]) {
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}